

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O3

bool __thiscall Refal2::CUnit::IsEqualWith(CUnit *this,CUnit *unit)

{
  TUnitType TVar1;
  bool bVar2;
  
  TVar1 = this->type;
  if (TVar1 != unit->type) {
    return false;
  }
  switch(TVar1) {
  case UT_Char:
    bVar2 = (this->field_1).c == (unit->field_1).c;
    break;
  case UT_Label:
  case UT_Number:
  case UT_Variable:
    bVar2 = (this->field_1).label == (unit->field_1).label;
    break;
  default:
    if (((TVar1 - UT_LeftParen < 0x31) &&
        ((0x1000000010001U >> ((ulong)(TVar1 - UT_LeftParen) & 0x3f) & 1) != 0)) ||
       (TVar1 == UT_RightBracket)) {
      return true;
    }
  case UT_Label|UT_Char:
  case UT_Number|UT_Char:
  case UT_Number|UT_Label:
  case UT_Number|UT_Label|UT_Char:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                  ,0x35,"bool Refal2::CUnit::IsEqualWith(const CUnit &) const");
  }
  return bVar2;
}

Assistant:

bool CUnit::IsEqualWith( const CUnit& unit ) const
{
	if( type != unit.type ) {
		return false;
	}
	switch( type ) {
		case UT_Char:
			return ( c == unit.c );
			break;
		case UT_Label:
			return ( label == unit.label );
			break;
		case UT_Number:
			return ( number == unit.number );
			break;
		case UT_Variable:
			return ( variable == unit.variable );
			break;
		case UT_LeftParen:
		case UT_RightParen:
		case UT_LeftBracket:
		case UT_RightBracket:
			return true;
		default:
			break;
	}
	assert( false );
	return false;
}